

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_trs.cc
# Opt level: O0

int obj_trust(int id,X509 *x)

{
  X509_CERT_AUX *pXVar1;
  int iVar2;
  ASN1_OBJECT *pAVar3;
  ASN1_OBJECT *pAVar4;
  ASN1_OBJECT *obj_1;
  size_t i_1;
  ASN1_OBJECT *obj;
  size_t i;
  X509_CERT_AUX *ax;
  X509 *x_local;
  int id_local;
  
  pXVar1 = x->aux;
  if (pXVar1 != (X509_CERT_AUX *)0x0) {
    for (obj = (ASN1_OBJECT *)0x0; pAVar3 = (ASN1_OBJECT *)sk_ASN1_OBJECT_num(pXVar1->reject),
        obj < pAVar3; obj = (ASN1_OBJECT *)((long)&obj->sn + 1)) {
      pAVar4 = (ASN1_OBJECT *)sk_ASN1_OBJECT_value(pXVar1->reject,(size_t)obj);
      iVar2 = OBJ_obj2nid(pAVar4);
      if (iVar2 == id) {
        return 2;
      }
    }
    for (obj_1 = (ASN1_OBJECT *)0x0; pAVar3 = (ASN1_OBJECT *)sk_ASN1_OBJECT_num(pXVar1->trust),
        obj_1 < pAVar3; obj_1 = (ASN1_OBJECT *)((long)&obj_1->sn + 1)) {
      pAVar4 = (ASN1_OBJECT *)sk_ASN1_OBJECT_value(pXVar1->trust,(size_t)obj_1);
      iVar2 = OBJ_obj2nid(pAVar4);
      if (iVar2 == id) {
        return 1;
      }
    }
  }
  return 3;
}

Assistant:

static int obj_trust(int id, X509 *x) {
  X509_CERT_AUX *ax = x->aux;
  if (!ax) {
    return X509_TRUST_UNTRUSTED;
  }
  for (size_t i = 0; i < sk_ASN1_OBJECT_num(ax->reject); i++) {
    const ASN1_OBJECT *obj = sk_ASN1_OBJECT_value(ax->reject, i);
    if (OBJ_obj2nid(obj) == id) {
      return X509_TRUST_REJECTED;
    }
  }
  for (size_t i = 0; i < sk_ASN1_OBJECT_num(ax->trust); i++) {
    const ASN1_OBJECT *obj = sk_ASN1_OBJECT_value(ax->trust, i);
    if (OBJ_obj2nid(obj) == id) {
      return X509_TRUST_TRUSTED;
    }
  }
  return X509_TRUST_UNTRUSTED;
}